

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O0

void __thiscall
amrex::MLEBTensorOp::compVelGrad
          (MLEBTensorOp *this,int amrlev,Array<MultiFab_*,_3> *fluxes,MultiFab *sol,Location loc)

{
  int iVar1;
  bool bVar2;
  FabType dir;
  MFIter *mfi_00;
  pointer pFVar3;
  MFItInfo *this_00;
  reference pvVar4;
  int in_R8D;
  int i_3;
  int j_3;
  int k_3;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> src;
  Array4<double> dst;
  Box *nbx;
  int idim;
  Box tzbx;
  iterator __end4_2;
  iterator __begin4_2;
  range_impl<amrex::Box> *__range4_2;
  Box tybx;
  iterator __end4_1;
  iterator __begin4_1;
  range_impl<amrex::Box> *__range4_1;
  Box txbx;
  iterator __end4;
  iterator __begin4;
  range_impl<amrex::Box> *__range4;
  Array4<double> fzfab;
  Array4<double> fyfab;
  Array4<double> fxfab;
  Elixir fzeli;
  Elixir fyeli;
  Elixir fxeli;
  Box zbx;
  Box ybx;
  Box xbx;
  Array4<const_double> vfab;
  FabType fabtyp;
  Box *bx;
  MFIter mfi;
  Array<FArrayBox,_3> fluxfab_tmp;
  MFItInfo mfi_info;
  int dim_fluxes;
  GpuArray<double,_3U> dxinv;
  Geometry *geom;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int mglev;
  Real dwdz;
  Real dvdz;
  Real dudz;
  Real dwdy;
  Real dvdy;
  Real dudy;
  Real dwdx;
  Real dvdx;
  Real dudx;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  Real dzi;
  Real dyi;
  Real dxi;
  Real dwdz_1;
  Real dvdz_1;
  Real dudz_1;
  Real dwdy_1;
  Real dvdy_1;
  Real dudy_1;
  Real dwdx_1;
  Real dvdx_1;
  Real dudx_1;
  int i_1;
  int j_1;
  int k_1;
  Dim3 hi_1;
  Dim3 lo_1;
  Real dzi_1;
  Real dyi_1;
  Real dxi_1;
  Real dwdz_2;
  Real dvdz_2;
  Real dudz_2;
  Real dwdy_2;
  Real dvdy_2;
  Real dudy_2;
  Real dwdx_2;
  Real dvdx_2;
  Real dudx_2;
  int i_2;
  int j_2;
  int k_2;
  Dim3 hi_2;
  Dim3 lo_2;
  Real dzi_2;
  Real dyi_2;
  Real dxi_2;
  MLMGBndry *in_stack_00019760;
  size_type in_stack_ffffffffffffe478;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffe480;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe488;
  Box *in_stack_ffffffffffffe490;
  MFItInfo *in_stack_ffffffffffffe4a0;
  Box *__return_storage_ptr__;
  FabArrayBase *in_stack_ffffffffffffe4a8;
  BaseFab<double> *this_01;
  MFIter *in_stack_ffffffffffffe4b0;
  MFIter *in_stack_ffffffffffffe4e0;
  MFIter *this_02;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_1b08;
  FabArray<amrex::FArrayBox> *local_1b00;
  int local_1ad8;
  CoordType local_1ad4;
  EBSupport local_1ad0;
  int local_1acc;
  double *local_1a88;
  long local_1a80;
  long local_1a78;
  long local_1a70;
  int local_1a68;
  int local_1a64;
  Box *in_stack_ffffffffffffe5a0;
  EBCellFlagFab *in_stack_ffffffffffffe5a8;
  long local_1a48;
  long local_1a40;
  long local_1a38;
  long local_1a30;
  int local_1a28;
  int local_1a24;
  int local_1a20;
  undefined1 local_1a04 [68];
  iterator local_19c0;
  iterator local_19a8;
  undefined1 local_1990 [40];
  undefined1 *local_1968;
  Box local_195c;
  iterator local_1940;
  iterator local_1928;
  undefined1 local_1910 [40];
  undefined1 *local_18e8;
  Box local_18dc;
  iterator local_18c0;
  iterator local_18a8;
  undefined1 local_1890 [40];
  undefined1 *local_1868;
  Array4<double> local_1860;
  Array4<double> local_1820;
  Array4<double> local_17e0 [3];
  long local_1700;
  long local_16f8;
  long local_16f0;
  long local_16e8;
  int local_16e0;
  int local_16dc;
  int local_16d8;
  FabType local_16c0;
  undefined1 local_16bc [28];
  undefined1 *local_16a0;
  undefined1 local_1688 [332];
  undefined4 local_153c;
  GpuArray<double,_3U> local_1538;
  __uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_1520;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_1518;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> local_1510;
  undefined4 local_1508;
  int local_1504;
  undefined8 local_14e0;
  EBSupport local_14d8;
  FabArray<amrex::EBCellFlagFab> *local_14d0;
  int local_14c4;
  CoordType CStack_14c0;
  EBSupport local_14bc;
  undefined8 local_14b8;
  int local_14b0;
  FabArray<amrex::EBCellFlagFab> *local_14a8;
  uint local_149c;
  CoordType CStack_1498;
  int local_1494;
  int local_1490;
  EBSupport local_148c;
  CoordType local_1488;
  int local_1484;
  long *local_1480;
  char *local_1478;
  char *local_1470;
  char *local_1468;
  int local_1460;
  EBSupport local_145c;
  CoordType local_1458;
  int local_1454;
  double **local_1450;
  reference local_1448;
  reference local_1440;
  reference local_1438;
  double local_1430;
  double local_1428;
  double local_1420;
  double local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13f8;
  double local_13f0;
  int local_13e4;
  int local_13e0;
  int local_13dc;
  undefined8 local_13d8;
  int local_13d0;
  undefined8 local_13c4;
  int local_13bc;
  undefined8 local_13b8;
  int local_13b0;
  undefined8 local_13a8;
  int local_13a0;
  GpuArray<double,_3U> *local_1380;
  long *local_1378;
  Array4<double> *local_1370;
  Box *local_1368;
  undefined8 local_1360;
  int local_1358;
  Box *local_1350;
  int local_1344;
  int iStack_1340;
  int local_133c;
  undefined8 local_1338;
  int local_1330;
  Box *local_1328;
  int local_131c;
  int iStack_1318;
  int local_1314;
  undefined4 local_1310;
  int local_130c;
  int local_1308;
  int local_1304;
  Array4<double> *local_1300;
  undefined4 local_12f8;
  int local_12f4;
  int local_12f0;
  int local_12ec;
  Array4<double> *local_12e8;
  undefined4 local_12e0;
  int local_12dc;
  int local_12d8;
  int local_12d4;
  Array4<double> *local_12d0;
  undefined4 local_12c8;
  int local_12c4;
  int local_12c0;
  int local_12bc;
  Array4<double> *local_12b8;
  undefined4 local_12b0;
  int local_12ac;
  int local_12a8;
  int local_12a4;
  Array4<double> *local_12a0;
  undefined4 local_1298;
  int local_1294;
  int local_1290;
  int local_128c;
  Array4<double> *local_1288;
  undefined4 local_1280;
  int local_127c;
  int local_1278;
  int local_1274;
  Array4<double> *local_1270;
  undefined4 local_1268;
  int local_1264;
  int local_1260;
  int local_125c;
  Array4<double> *local_1258;
  undefined4 local_1250;
  int local_124c;
  int local_1248;
  int local_1244;
  Array4<double> *local_1240;
  undefined4 local_1238;
  int local_1234;
  int local_1230;
  int local_122c;
  long *local_1228;
  undefined4 local_1220;
  int local_121c;
  int local_1218;
  int local_1214;
  long *local_1210;
  undefined4 local_1208;
  int local_1204;
  int local_1200;
  int local_11fc;
  long *local_11f8;
  undefined4 local_11f0;
  int local_11ec;
  int local_11e8;
  int local_11e4;
  long *local_11e0;
  undefined4 local_11d8;
  int local_11d4;
  int local_11d0;
  int local_11cc;
  long *local_11c8;
  undefined4 local_11c0;
  int local_11bc;
  int local_11b8;
  int local_11b4;
  long *local_11b0;
  undefined4 local_11a8;
  int local_11a4;
  int local_11a0;
  int local_119c;
  long *local_1198;
  undefined4 local_1190;
  int local_118c;
  int local_1188;
  int local_1184;
  long *local_1180;
  undefined4 local_1178;
  int local_1174;
  int local_1170;
  int local_116c;
  long *local_1168;
  undefined4 local_1160;
  int local_115c;
  int local_1158;
  int local_1154;
  long *local_1150;
  undefined4 local_1148;
  int local_1144;
  int local_1140;
  int local_113c;
  long *local_1138;
  undefined4 local_1130;
  int local_112c;
  int local_1128;
  int local_1124;
  long *local_1120;
  undefined4 local_1118;
  int local_1114;
  int local_1110;
  int local_110c;
  long *local_1108;
  undefined4 local_1100;
  int local_10fc;
  int local_10f8;
  int local_10f4;
  long *local_10f0;
  undefined4 local_10e8;
  int local_10e4;
  int local_10e0;
  int local_10dc;
  long *local_10d8;
  undefined4 local_10d0;
  int local_10cc;
  int local_10c8;
  int local_10c4;
  long *local_10c0;
  undefined4 local_10b8;
  int local_10b4;
  int local_10b0;
  int local_10ac;
  long *local_10a8;
  undefined4 local_10a0;
  int local_109c;
  int local_1098;
  int local_1094;
  long *local_1090;
  undefined4 local_1088;
  int local_1084;
  int local_1080;
  int local_107c;
  long *local_1078;
  undefined4 local_1070;
  int local_106c;
  int local_1068;
  int local_1064;
  long *local_1060;
  undefined4 local_1058;
  int local_1054;
  int local_1050;
  int local_104c;
  long *local_1048;
  undefined4 local_1040;
  int local_103c;
  int local_1038;
  int local_1034;
  long *local_1030;
  undefined4 local_1028;
  int local_1024;
  int local_1020;
  int local_101c;
  long *local_1018;
  undefined4 local_1010;
  int local_100c;
  int local_1008;
  int local_1004;
  long *local_1000;
  undefined4 local_ff8;
  int local_ff4;
  int local_ff0;
  int local_fec;
  long *local_fe8;
  undefined4 local_fe0;
  int local_fdc;
  int local_fd8;
  int local_fd4;
  long *local_fd0;
  undefined4 local_fc8;
  int local_fc4;
  int local_fc0;
  int local_fbc;
  long *local_fb8;
  undefined4 local_fb0;
  int local_fac;
  int local_fa8;
  int local_fa4;
  long *local_fa0;
  undefined4 local_f98;
  int local_f94;
  int local_f90;
  int local_f8c;
  long *local_f88;
  undefined4 local_f80;
  int local_f7c;
  int local_f78;
  int local_f74;
  long *local_f70;
  double local_f68;
  double local_f60;
  double local_f58;
  double local_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  double local_f30;
  double local_f28;
  int local_f1c;
  int local_f18;
  uint local_f14;
  GpuArray<double,_3U> *local_eb8;
  long *local_eb0;
  Array4<double> *local_ea8;
  Box *local_ea0;
  Box *local_e88;
  Box *local_e60;
  undefined4 local_e48;
  uint local_e44;
  int local_e40;
  int local_e3c;
  Array4<double> *local_e38;
  undefined4 local_e30;
  uint local_e2c;
  int local_e28;
  int local_e24;
  Array4<double> *local_e20;
  undefined4 local_e18;
  uint local_e14;
  int local_e10;
  int local_e0c;
  Array4<double> *local_e08;
  undefined4 local_e00;
  uint local_dfc;
  int local_df8;
  int local_df4;
  Array4<double> *local_df0;
  undefined4 local_de8;
  uint local_de4;
  int local_de0;
  int local_ddc;
  Array4<double> *local_dd8;
  undefined4 local_dd0;
  uint local_dcc;
  int local_dc8;
  int local_dc4;
  Array4<double> *local_dc0;
  undefined4 local_db8;
  uint local_db4;
  int local_db0;
  int local_dac;
  Array4<double> *local_da8;
  undefined4 local_da0;
  uint local_d9c;
  int local_d98;
  int local_d94;
  Array4<double> *local_d90;
  undefined4 local_d88;
  uint local_d84;
  int local_d80;
  int local_d7c;
  Array4<double> *local_d78;
  undefined4 local_d70;
  int local_d6c;
  int local_d68;
  int local_d64;
  long *local_d60;
  undefined4 local_d58;
  int local_d54;
  int local_d50;
  int local_d4c;
  long *local_d48;
  undefined4 local_d40;
  int local_d3c;
  int local_d38;
  int local_d34;
  long *local_d30;
  undefined4 local_d28;
  int local_d24;
  int local_d20;
  int local_d1c;
  long *local_d18;
  undefined4 local_d10;
  int local_d0c;
  int local_d08;
  int local_d04;
  long *local_d00;
  undefined4 local_cf8;
  int local_cf4;
  int local_cf0;
  int local_cec;
  long *local_ce8;
  undefined4 local_ce0;
  int local_cdc;
  int local_cd8;
  int local_cd4;
  long *local_cd0;
  undefined4 local_cc8;
  int local_cc4;
  int local_cc0;
  int local_cbc;
  long *local_cb8;
  undefined4 local_cb0;
  int local_cac;
  int local_ca8;
  int local_ca4;
  long *local_ca0;
  undefined4 local_c98;
  int local_c94;
  int local_c90;
  int local_c8c;
  long *local_c88;
  undefined4 local_c80;
  int local_c7c;
  int local_c78;
  int local_c74;
  long *local_c70;
  undefined4 local_c68;
  int local_c64;
  int local_c60;
  int local_c5c;
  long *local_c58;
  undefined4 local_c50;
  uint local_c4c;
  int local_c48;
  int local_c44;
  long *local_c40;
  undefined4 local_c38;
  uint local_c34;
  int local_c30;
  int local_c2c;
  long *local_c28;
  undefined4 local_c20;
  uint local_c1c;
  int local_c18;
  int local_c14;
  long *local_c10;
  undefined4 local_c08;
  uint local_c04;
  int local_c00;
  int local_bfc;
  long *local_bf8;
  undefined4 local_bf0;
  uint local_bec;
  int local_be8;
  int local_be4;
  long *local_be0;
  undefined4 local_bd8;
  uint local_bd4;
  int local_bd0;
  int local_bcc;
  long *local_bc8;
  undefined4 local_bc0;
  uint local_bbc;
  int local_bb8;
  int local_bb4;
  long *local_bb0;
  undefined4 local_ba8;
  uint local_ba4;
  int local_ba0;
  int local_b9c;
  long *local_b98;
  undefined4 local_b90;
  uint local_b8c;
  int local_b88;
  int local_b84;
  long *local_b80;
  undefined4 local_b78;
  uint local_b74;
  int local_b70;
  int local_b6c;
  long *local_b68;
  undefined4 local_b60;
  uint local_b5c;
  int local_b58;
  int local_b54;
  long *local_b50;
  undefined4 local_b48;
  uint local_b44;
  int local_b40;
  int local_b3c;
  long *local_b38;
  undefined4 local_b30;
  uint local_b2c;
  int local_b28;
  int local_b24;
  long *local_b20;
  undefined4 local_b18;
  uint local_b14;
  int local_b10;
  int local_b0c;
  long *local_b08;
  undefined4 local_b00;
  uint local_afc;
  int local_af8;
  int local_af4;
  long *local_af0;
  undefined4 local_ae8;
  uint local_ae4;
  int local_ae0;
  int local_adc;
  long *local_ad8;
  undefined4 local_ad0;
  uint local_acc;
  int local_ac8;
  int local_ac4;
  long *local_ac0;
  undefined4 local_ab8;
  uint local_ab4;
  int local_ab0;
  int local_aac;
  long *local_aa8;
  double local_aa0;
  double local_a98;
  double local_a90;
  double local_a88;
  double local_a80;
  double local_a78;
  double local_a70;
  double local_a68;
  double local_a60;
  int local_a54;
  int local_a50;
  int local_a4c;
  undefined8 local_a48;
  int local_a40;
  undefined8 local_a34;
  int local_a2c;
  undefined8 local_a28;
  int local_a20;
  undefined8 local_a18;
  int local_a10;
  GpuArray<double,_3U> *local_9f0;
  long *local_9e8;
  Array4<double> *local_9e0;
  Box *local_9d8;
  undefined8 local_9d0;
  int local_9c8;
  Box *local_9c0;
  int local_9b4;
  int iStack_9b0;
  int local_9ac;
  undefined8 local_9a8;
  int local_9a0;
  Box *local_998;
  int local_98c;
  int iStack_988;
  int local_984;
  undefined4 local_980;
  int local_97c;
  int local_978;
  int local_974;
  Array4<double> *local_970;
  undefined4 local_968;
  int local_964;
  int local_960;
  int local_95c;
  Array4<double> *local_958;
  undefined4 local_950;
  int local_94c;
  int local_948;
  int local_944;
  Array4<double> *local_940;
  undefined4 local_938;
  int local_934;
  int local_930;
  int local_92c;
  Array4<double> *local_928;
  undefined4 local_920;
  int local_91c;
  int local_918;
  int local_914;
  Array4<double> *local_910;
  undefined4 local_908;
  int local_904;
  int local_900;
  int local_8fc;
  Array4<double> *local_8f8;
  undefined4 local_8f0;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  Array4<double> *local_8e0;
  undefined4 local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  Array4<double> *local_8c8;
  undefined4 local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  Array4<double> *local_8b0;
  undefined4 local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  long *local_898;
  undefined4 local_890;
  int local_88c;
  int local_888;
  int local_884;
  long *local_880;
  undefined4 local_878;
  int local_874;
  int local_870;
  int local_86c;
  long *local_868;
  undefined4 local_860;
  int local_85c;
  int local_858;
  int local_854;
  undefined8 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  int in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7c4;
  MLEBTensorOp *in_stack_fffffffffffff7c8;
  Dim3 local_3b0;
  Dim3 local_3a0;
  Dim3 local_390;
  int local_384;
  Box *local_380;
  double *local_378;
  Dim3 local_370;
  Box *local_360;
  int local_358;
  int iStack_354;
  int local_350;
  undefined4 local_34c;
  Box *local_348;
  undefined4 local_33c;
  Box *local_338;
  undefined4 local_32c;
  Box *local_328;
  Dim3 local_320;
  Box *local_310;
  int local_308;
  int iStack_304;
  int local_300;
  undefined4 local_2fc;
  IntVect *local_2f8;
  undefined4 local_2ec;
  IntVect *local_2e8;
  undefined4 local_2dc;
  IntVect *local_2d8;
  Dim3 local_2d0;
  Dim3 local_2c0;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  Box *local_290;
  double *local_288;
  Dim3 local_280;
  Box *local_270;
  int local_268;
  int iStack_264;
  int local_260;
  undefined4 local_25c;
  Box *local_258;
  undefined4 local_24c;
  Box *local_248;
  undefined4 local_23c;
  Box *local_238;
  Dim3 local_230;
  Box *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_1504 = in_R8D;
  if ((in_R8D != 0) && (in_R8D != 1)) {
    local_1468 = "MLEBTensorOp::compVelGrad() unknown location for VelGradients.";
    Abort_host((char *)in_stack_ffffffffffffe490);
  }
  local_1508 = 0;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                *)in_stack_ffffffffffffe480,in_stack_ffffffffffffe478);
  mfi_00 = (MFIter *)
           std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::get
                     ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                      in_stack_ffffffffffffe480);
  applyBCTensor(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0,
                (MultiFab *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                (BCMode)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
                (StateMode)in_stack_fffffffffffff7b0,in_stack_00019760);
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe480,(size_type)mfi_00);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_ffffffffffffe480,(size_type)mfi_00);
  pFVar3 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_ffffffffffffe480);
  if (pFVar3 == (pointer)0x0) {
    local_1b00 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_1b00 = (FabArray<amrex::FArrayBox> *)
                 __dynamic_cast(pFVar3,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
  }
  local_1510._M_head_impl = local_1b00;
  if (local_1b00 == (FabArray<amrex::FArrayBox> *)0x0) {
    local_1b08._M_head_impl = (PCData<amrex::FArrayBox> *)0x0;
  }
  else {
    local_1b08._M_head_impl =
         (PCData<amrex::FArrayBox> *)
         EBFArrayBoxFactory::getMultiEBCellFlagFab((EBFArrayBoxFactory *)in_stack_ffffffffffffe480);
  }
  local_1518._M_head_impl = local_1b08._M_head_impl;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffe480,(size_type)mfi_00);
  local_1520._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
       (tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
        )Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                   ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                    in_stack_ffffffffffffe480,(size_type)mfi_00);
  CoordSys::InvCellSizeArray
            (&local_1538,
             (CoordSys *)
             local_1520._M_t.
             super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl);
  local_153c = 9;
  this_02 = (MFIter *)(local_1688 + 0x138);
  MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffe490);
  this_00 = MFItInfo::EnableTiling((MFItInfo *)this_02,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_00,true);
  std::array<amrex::FArrayBox,_3UL>::array
            ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe490);
  MFIter::MFIter(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,in_stack_ffffffffffffe4a0);
  while (bVar2 = MFIter::isValid((MFIter *)local_1688), bVar2) {
    MFIter::tilebox(in_stack_ffffffffffffe4e0);
    local_16a0 = local_16bc;
    if ((FabArray<amrex::EBCellFlagFab> *)local_1518._M_head_impl ==
        (FabArray<amrex::EBCellFlagFab> *)0x0) {
      dir = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[](in_stack_ffffffffffffe480,mfi_00);
      dir = EBCellFlagFab::getType(in_stack_ffffffffffffe5a8,in_stack_ffffffffffffe5a0);
    }
    local_16c0 = dir;
    if (dir != covered) {
      if (dir == regular) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffe488,(MFIter *)in_stack_ffffffffffffe480);
        MFIter::nodaltilebox(this_02,dir);
        MFIter::nodaltilebox(this_02,dir);
        MFIter::nodaltilebox(this_02,dir);
        in_stack_ffffffffffffe4e0 = (MFIter *)0x0;
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,(size_type)mfi_00);
        FArrayBox::resize((FArrayBox *)in_stack_ffffffffffffe490,(Box *)in_stack_ffffffffffffe488,
                          (int)((ulong)in_stack_ffffffffffffe480 >> 0x20),(Arena *)mfi_00);
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,(size_type)mfi_00);
        FArrayBox::resize((FArrayBox *)in_stack_ffffffffffffe490,(Box *)in_stack_ffffffffffffe488,
                          (int)((ulong)in_stack_ffffffffffffe480 >> 0x20),(Arena *)mfi_00);
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,(size_type)mfi_00);
        FArrayBox::resize((FArrayBox *)in_stack_ffffffffffffe490,(Box *)in_stack_ffffffffffffe488,
                          (int)((ulong)in_stack_ffffffffffffe480 >> 0x20),(Arena *)mfi_00);
        this_01 = (BaseFab<double> *)0x0;
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,(size_type)mfi_00);
        BaseFab<double>::elixir<double,_0>(this_01);
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,(size_type)mfi_00);
        BaseFab<double>::elixir<double,_0>(this_01);
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,(size_type)mfi_00);
        BaseFab<double>::elixir<double,_0>(this_01);
        local_1438 = std::array<amrex::FArrayBox,_3UL>::operator[]
                               ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,
                                (size_type)mfi_00);
        local_288 = (local_1438->super_BaseFab<double>).dptr;
        local_290 = &(local_1438->super_BaseFab<double>).domain;
        local_294 = (local_1438->super_BaseFab<double>).nvar;
        local_23c = 0;
        local_268 = (local_290->smallend).vect[0];
        local_24c = 1;
        iStack_264 = (local_1438->super_BaseFab<double>).domain.smallend.vect[1];
        local_2b0.x = (local_290->smallend).vect[0];
        local_2b0.y = (local_290->smallend).vect[1];
        local_25c = 2;
        local_2b0.z = (local_1438->super_BaseFab<double>).domain.smallend.vect[2];
        local_1e8 = &(local_1438->super_BaseFab<double>).domain.bigend;
        local_1ec = 0;
        local_218 = local_1e8->vect[0] + 1;
        local_1f8 = &(local_1438->super_BaseFab<double>).domain.bigend;
        local_1fc = 1;
        iStack_214 = (local_1438->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        local_208 = &(local_1438->super_BaseFab<double>).domain.bigend;
        local_20c = 2;
        local_2d0.z = (local_1438->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        local_2d0.y = iStack_214;
        local_2d0.x = local_218;
        local_2c0._0_8_ = local_2d0._0_8_;
        local_2c0.z = local_2d0.z;
        local_2a0._0_8_ = local_2b0._0_8_;
        local_2a0.z = local_2b0.z;
        local_280._0_8_ = local_2b0._0_8_;
        local_280.z = local_2b0.z;
        local_270 = local_290;
        local_260 = local_2b0.z;
        local_258 = local_290;
        local_248 = local_290;
        local_238 = local_290;
        local_230._0_8_ = local_2d0._0_8_;
        local_230.z = local_2d0.z;
        local_220 = local_290;
        local_210 = local_2d0.z;
        Array4<double>::Array4(local_17e0,local_288,&local_2a0,&local_2c0,local_294);
        local_1440 = std::array<amrex::FArrayBox,_3UL>::operator[]
                               ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,
                                (size_type)mfi_00);
        local_198 = (local_1440->super_BaseFab<double>).dptr;
        local_1a0 = &(local_1440->super_BaseFab<double>).domain;
        local_1a4 = (local_1440->super_BaseFab<double>).nvar;
        local_14c = 0;
        local_178 = (local_1a0->smallend).vect[0];
        local_15c = 1;
        iStack_174 = (local_1440->super_BaseFab<double>).domain.smallend.vect[1];
        local_1c0.x = (local_1a0->smallend).vect[0];
        local_1c0.y = (local_1a0->smallend).vect[1];
        local_16c = 2;
        local_1c0.z = (local_1440->super_BaseFab<double>).domain.smallend.vect[2];
        local_f8 = &(local_1440->super_BaseFab<double>).domain.bigend;
        local_fc = 0;
        local_128 = local_f8->vect[0] + 1;
        local_108 = &(local_1440->super_BaseFab<double>).domain.bigend;
        local_10c = 1;
        iStack_124 = (local_1440->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        local_118 = &(local_1440->super_BaseFab<double>).domain.bigend;
        local_11c = 2;
        local_1e0.z = (local_1440->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        local_1e0.y = iStack_124;
        local_1e0.x = local_128;
        local_1d0._0_8_ = local_1e0._0_8_;
        local_1d0.z = local_1e0.z;
        local_1b0._0_8_ = local_1c0._0_8_;
        local_1b0.z = local_1c0.z;
        local_190._0_8_ = local_1c0._0_8_;
        local_190.z = local_1c0.z;
        local_180 = local_1a0;
        local_170 = local_1c0.z;
        local_168 = local_1a0;
        local_158 = local_1a0;
        local_148 = local_1a0;
        local_140._0_8_ = local_1e0._0_8_;
        local_140.z = local_1e0.z;
        local_130 = local_1a0;
        local_120 = local_1e0.z;
        Array4<double>::Array4(&local_1820,local_198,&local_1b0,&local_1d0,local_1a4);
        local_1448 = std::array<amrex::FArrayBox,_3UL>::operator[]
                               ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,
                                (size_type)mfi_00);
        local_a8 = (local_1448->super_BaseFab<double>).dptr;
        local_b0 = &(local_1448->super_BaseFab<double>).domain;
        local_b4 = (local_1448->super_BaseFab<double>).nvar;
        local_5c = 0;
        local_88 = (local_b0->smallend).vect[0];
        local_6c = 1;
        iStack_84 = (local_1448->super_BaseFab<double>).domain.smallend.vect[1];
        local_d0.x = (local_b0->smallend).vect[0];
        local_d0.y = (local_b0->smallend).vect[1];
        local_7c = 2;
        local_d0.z = (local_1448->super_BaseFab<double>).domain.smallend.vect[2];
        local_8 = &(local_1448->super_BaseFab<double>).domain.bigend;
        local_c = 0;
        local_38 = local_8->vect[0] + 1;
        local_18 = &(local_1448->super_BaseFab<double>).domain.bigend;
        local_1c = 1;
        iStack_34 = (local_1448->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        local_28 = &(local_1448->super_BaseFab<double>).domain.bigend;
        local_2c = 2;
        local_f0.z = (local_1448->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        local_f0.y = iStack_34;
        local_f0.x = local_38;
        local_dc._0_8_ = local_f0._0_8_;
        local_dc.z = local_f0.z;
        local_c0._0_8_ = local_d0._0_8_;
        local_c0.z = local_d0.z;
        local_a0._0_8_ = local_d0._0_8_;
        local_a0.z = local_d0.z;
        local_90 = local_b0;
        local_80 = local_d0.z;
        local_78 = local_b0;
        local_68 = local_b0;
        local_58 = local_b0;
        local_50._0_8_ = local_f0._0_8_;
        local_50.z = local_f0.z;
        local_40 = local_b0;
        local_30 = local_f0.z;
        Array4<double>::Array4(&local_1860,local_a8,&local_c0,&local_dc,local_b4);
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe480);
        local_1868 = local_1890;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe480);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe480);
        while (bVar2 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_18a8,&local_18c0), bVar2) {
          __return_storage_ptr__ = &local_18dc;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    (__return_storage_ptr__,&local_18a8);
          local_1370 = local_17e0;
          local_1378 = &local_1700;
          local_1380 = &local_1538;
          local_1344 = (__return_storage_ptr__->smallend).vect[0];
          iStack_1340 = (__return_storage_ptr__->smallend).vect[1];
          local_13b8 = *(undefined8 *)(__return_storage_ptr__->smallend).vect;
          local_131c = (__return_storage_ptr__->bigend).vect[0];
          iStack_1318 = (__return_storage_ptr__->bigend).vect[1];
          local_13d8 = *(undefined8 *)(__return_storage_ptr__->bigend).vect;
          local_13d0 = (__return_storage_ptr__->bigend).vect[2];
          local_13b0 = (__return_storage_ptr__->smallend).vect[2];
          for (local_13dc = local_13b0; iVar1 = iStack_1340, local_13dc <= local_13d0;
              local_13dc = local_13dc + 1) {
            while (local_13e0 = iVar1, iVar1 = local_1344, local_13e0 <= iStack_1318) {
              while (local_13e4 = iVar1, local_13e4 <= local_131c) {
                local_f74 = local_13e4;
                local_f78 = local_13e0;
                local_f7c = local_13dc;
                local_f80 = 0;
                local_f8c = local_13e4 + -1;
                local_f90 = local_13e0;
                local_f94 = local_13dc;
                local_f98 = 0;
                local_13f0 = (*(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_13e0 - local_16dc) * local_16f8 +
                               (local_13dc - local_16d8) * local_16f0) * 8) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_f8c - local_16e0) +
                               (local_13e0 - local_16dc) * local_16f8 +
                              (local_13dc - local_16d8) * local_16f0) * 8)) * local_1538.arr[0];
                local_fa4 = local_13e4;
                local_fa8 = local_13e0;
                local_fac = local_13dc;
                local_fb0 = 1;
                local_fbc = local_13e4 + -1;
                local_fc0 = local_13e0;
                local_fc4 = local_13dc;
                local_fc8 = 1;
                local_13f8 = (*(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_13e0 - local_16dc) * local_16f8 +
                                (local_13dc - local_16d8) * local_16f0 + local_16e8) * 8) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_fbc - local_16e0) +
                               (local_13e0 - local_16dc) * local_16f8 +
                               (local_13dc - local_16d8) * local_16f0 + local_16e8) * 8)) *
                             local_1538.arr[0];
                local_fd4 = local_13e4;
                local_fd8 = local_13e0;
                local_fdc = local_13dc;
                local_fe0 = 2;
                local_fec = local_13e4 + -1;
                local_ff0 = local_13e0;
                local_ff4 = local_13dc;
                local_ff8 = 2;
                local_1400 = (*(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_13e0 - local_16dc) * local_16f8 +
                                (local_13dc - local_16d8) * local_16f0 + local_16e8 * 2) * 8) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_fec - local_16e0) +
                               (local_13e0 - local_16dc) * local_16f8 +
                               (local_13dc - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                             local_1538.arr[0];
                local_1004 = local_13e4;
                local_1008 = local_13e0 + 1;
                local_100c = local_13dc;
                local_1010 = 0;
                local_101c = local_13e4 + -1;
                local_1020 = local_13e0 + 1;
                local_1024 = local_13dc;
                local_1028 = 0;
                local_1034 = local_13e4;
                local_1038 = local_13e0 + -1;
                local_103c = local_13dc;
                local_1040 = 0;
                local_104c = local_13e4 + -1;
                local_1050 = local_13e0 + -1;
                local_1054 = local_13dc;
                local_1058 = 0;
                local_1408 = (((*(double *)
                                 (local_1700 +
                                 ((long)(local_13e4 - local_16e0) +
                                  (local_1008 - local_16dc) * local_16f8 +
                                 (local_13dc - local_16d8) * local_16f0) * 8) +
                               *(double *)
                                (local_1700 +
                                ((long)(local_101c - local_16e0) +
                                 (local_1020 - local_16dc) * local_16f8 +
                                (local_13dc - local_16d8) * local_16f0) * 8)) -
                              *(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_1038 - local_16dc) * local_16f8 +
                               (local_13dc - local_16d8) * local_16f0) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_104c - local_16e0) +
                               (local_1050 - local_16dc) * local_16f8 +
                              (local_13dc - local_16d8) * local_16f0) * 8)) *
                             local_1538.arr[1] * 0.25;
                local_1064 = local_13e4;
                local_1068 = local_13e0 + 1;
                local_106c = local_13dc;
                local_1070 = 1;
                local_107c = local_13e4 + -1;
                local_1080 = local_13e0 + 1;
                local_1084 = local_13dc;
                local_1088 = 1;
                local_1094 = local_13e4;
                local_1098 = local_13e0 + -1;
                local_109c = local_13dc;
                local_10a0 = 1;
                local_10ac = local_13e4 + -1;
                local_10b0 = local_13e0 + -1;
                local_10b4 = local_13dc;
                local_10b8 = 1;
                local_1410 = (((*(double *)
                                 (local_1700 +
                                 ((long)(local_13e4 - local_16e0) +
                                  (local_1068 - local_16dc) * local_16f8 +
                                  (local_13dc - local_16d8) * local_16f0 + local_16e8) * 8) +
                               *(double *)
                                (local_1700 +
                                ((long)(local_107c - local_16e0) +
                                 (local_1080 - local_16dc) * local_16f8 +
                                 (local_13dc - local_16d8) * local_16f0 + local_16e8) * 8)) -
                              *(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_1098 - local_16dc) * local_16f8 +
                                (local_13dc - local_16d8) * local_16f0 + local_16e8) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_10ac - local_16e0) +
                               (local_10b0 - local_16dc) * local_16f8 +
                               (local_13dc - local_16d8) * local_16f0 + local_16e8) * 8)) *
                             local_1538.arr[1] * 0.25;
                local_10c4 = local_13e4;
                local_10c8 = local_13e0 + 1;
                local_10cc = local_13dc;
                local_10d0 = 2;
                local_10dc = local_13e4 + -1;
                local_10e0 = local_13e0 + 1;
                local_10e4 = local_13dc;
                local_10e8 = 2;
                local_10f4 = local_13e4;
                local_10f8 = local_13e0 + -1;
                local_10fc = local_13dc;
                local_1100 = 2;
                local_110c = local_13e4 + -1;
                local_1110 = local_13e0 + -1;
                local_1114 = local_13dc;
                local_1118 = 2;
                local_1418 = (((*(double *)
                                 (local_1700 +
                                 ((long)(local_13e4 - local_16e0) +
                                  (local_10c8 - local_16dc) * local_16f8 +
                                  (local_13dc - local_16d8) * local_16f0 + local_16e8 * 2) * 8) +
                               *(double *)
                                (local_1700 +
                                ((long)(local_10dc - local_16e0) +
                                 (local_10e0 - local_16dc) * local_16f8 +
                                 (local_13dc - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                              *(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_10f8 - local_16dc) * local_16f8 +
                                (local_13dc - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_110c - local_16e0) +
                               (local_1110 - local_16dc) * local_16f8 +
                               (local_13dc - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                             local_1538.arr[1] * 0.25;
                local_1124 = local_13e4;
                local_1128 = local_13e0;
                local_112c = local_13dc + 1;
                local_1130 = 0;
                local_113c = local_13e4 + -1;
                local_1140 = local_13e0;
                local_1144 = local_13dc + 1;
                local_1148 = 0;
                local_1154 = local_13e4;
                local_1158 = local_13e0;
                local_115c = local_13dc + -1;
                local_1160 = 0;
                local_116c = local_13e4 + -1;
                local_1170 = local_13e0;
                local_1174 = local_13dc + -1;
                local_1178 = 0;
                local_1420 = (((*(double *)
                                 (local_1700 +
                                 ((long)(local_13e4 - local_16e0) +
                                  (local_13e0 - local_16dc) * local_16f8 +
                                 (local_112c - local_16d8) * local_16f0) * 8) +
                               *(double *)
                                (local_1700 +
                                ((long)(local_113c - local_16e0) +
                                 (local_13e0 - local_16dc) * local_16f8 +
                                (local_1144 - local_16d8) * local_16f0) * 8)) -
                              *(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_13e0 - local_16dc) * local_16f8 +
                               (local_115c - local_16d8) * local_16f0) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_116c - local_16e0) +
                               (local_13e0 - local_16dc) * local_16f8 +
                              (local_1174 - local_16d8) * local_16f0) * 8)) *
                             local_1538.arr[2] * 0.25;
                local_1184 = local_13e4;
                local_1188 = local_13e0;
                local_118c = local_13dc + 1;
                local_1190 = 1;
                local_119c = local_13e4 + -1;
                local_11a0 = local_13e0;
                local_11a4 = local_13dc + 1;
                local_11a8 = 1;
                local_11b4 = local_13e4;
                local_11b8 = local_13e0;
                local_11bc = local_13dc + -1;
                local_11c0 = 1;
                local_11cc = local_13e4 + -1;
                local_11d0 = local_13e0;
                local_11d4 = local_13dc + -1;
                local_11d8 = 1;
                local_1428 = (((*(double *)
                                 (local_1700 +
                                 ((long)(local_13e4 - local_16e0) +
                                  (local_13e0 - local_16dc) * local_16f8 +
                                  (local_118c - local_16d8) * local_16f0 + local_16e8) * 8) +
                               *(double *)
                                (local_1700 +
                                ((long)(local_119c - local_16e0) +
                                 (local_13e0 - local_16dc) * local_16f8 +
                                 (local_11a4 - local_16d8) * local_16f0 + local_16e8) * 8)) -
                              *(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_13e0 - local_16dc) * local_16f8 +
                                (local_11bc - local_16d8) * local_16f0 + local_16e8) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_11cc - local_16e0) +
                               (local_13e0 - local_16dc) * local_16f8 +
                               (local_11d4 - local_16d8) * local_16f0 + local_16e8) * 8)) *
                             local_1538.arr[2] * 0.25;
                local_11e4 = local_13e4;
                local_11e8 = local_13e0;
                local_11ec = local_13dc + 1;
                local_11f0 = 2;
                local_11fc = local_13e4 + -1;
                local_1200 = local_13e0;
                local_1204 = local_13dc + 1;
                local_1208 = 2;
                local_1214 = local_13e4;
                local_1218 = local_13e0;
                local_121c = local_13dc + -1;
                local_1220 = 2;
                local_122c = local_13e4 + -1;
                local_1230 = local_13e0;
                local_1234 = local_13dc + -1;
                local_1238 = 2;
                local_1430 = (((*(double *)
                                 (local_1700 +
                                 ((long)(local_13e4 - local_16e0) +
                                  (local_13e0 - local_16dc) * local_16f8 +
                                  (local_11ec - local_16d8) * local_16f0 + local_16e8 * 2) * 8) +
                               *(double *)
                                (local_1700 +
                                ((long)(local_11fc - local_16e0) +
                                 (local_13e0 - local_16dc) * local_16f8 +
                                 (local_1204 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                              *(double *)
                               (local_1700 +
                               ((long)(local_13e4 - local_16e0) +
                                (local_13e0 - local_16dc) * local_16f8 +
                                (local_121c - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_122c - local_16e0) +
                               (local_13e0 - local_16dc) * local_16f8 +
                               (local_1234 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                             local_1538.arr[2] * 0.25;
                local_1244 = local_13e4;
                local_1248 = local_13e0;
                local_124c = local_13dc;
                local_1250 = 0;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride] = local_13f0;
                local_125c = local_13e4;
                local_1260 = local_13e0;
                local_1264 = local_13dc;
                local_1268 = 1;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride] = local_13f8;
                local_1274 = local_13e4;
                local_1278 = local_13e0;
                local_127c = local_13dc;
                local_1280 = 2;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride * 2] = local_1400;
                local_128c = local_13e4;
                local_1290 = local_13e0;
                local_1294 = local_13dc;
                local_1298 = 3;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride * 3] = local_1408;
                local_12a4 = local_13e4;
                local_12a8 = local_13e0;
                local_12ac = local_13dc;
                local_12b0 = 4;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride * 4] = local_1410;
                local_12bc = local_13e4;
                local_12c0 = local_13e0;
                local_12c4 = local_13dc;
                local_12c8 = 5;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride * 5] = local_1418;
                local_12d4 = local_13e4;
                local_12d8 = local_13e0;
                local_12dc = local_13dc;
                local_12e0 = 6;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride * 6] = local_1420;
                local_12ec = local_13e4;
                local_12f0 = local_13e0;
                local_12f4 = local_13dc;
                local_12f8 = 7;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride * 7] = local_1428;
                local_1304 = local_13e4;
                local_1308 = local_13e0;
                local_130c = local_13dc;
                local_1310 = 8;
                local_17e0[0].p
                [(long)(local_13e4 - local_17e0[0].begin.x) +
                 (local_13e0 - local_17e0[0].begin.y) * local_17e0[0].jstride +
                 (local_13dc - local_17e0[0].begin.z) * local_17e0[0].kstride +
                 local_17e0[0].nstride * 8] = local_1430;
                local_1300 = local_1370;
                local_12e8 = local_1370;
                local_12d0 = local_1370;
                local_12b8 = local_1370;
                local_12a0 = local_1370;
                local_1288 = local_1370;
                local_1270 = local_1370;
                local_1258 = local_1370;
                local_1240 = local_1370;
                local_1228 = local_1378;
                local_1210 = local_1378;
                local_11f8 = local_1378;
                local_11e0 = local_1378;
                local_11c8 = local_1378;
                local_11b0 = local_1378;
                local_1198 = local_1378;
                local_1180 = local_1378;
                local_1168 = local_1378;
                local_1150 = local_1378;
                local_1138 = local_1378;
                local_1120 = local_1378;
                local_1108 = local_1378;
                local_10f0 = local_1378;
                local_10d8 = local_1378;
                local_10c0 = local_1378;
                local_10a8 = local_1378;
                local_1090 = local_1378;
                local_1078 = local_1378;
                local_1060 = local_1378;
                local_1048 = local_1378;
                local_1030 = local_1378;
                local_1018 = local_1378;
                local_1000 = local_1378;
                local_fe8 = local_1378;
                local_fd0 = local_1378;
                local_fb8 = local_1378;
                local_fa0 = local_1378;
                local_f88 = local_1378;
                local_f70 = local_1378;
                iVar1 = local_13e4 + 1;
              }
              iVar1 = local_13e0 + 1;
            }
          }
          local_13c4 = local_13d8;
          local_13bc = local_13d0;
          local_13a8 = local_13b8;
          local_13a0 = local_13b0;
          local_1368 = __return_storage_ptr__;
          local_1360 = local_13b8;
          local_1358 = local_13b0;
          local_1350 = __return_storage_ptr__;
          local_133c = local_13b0;
          local_1338 = local_13d8;
          local_1330 = local_13d0;
          local_1328 = __return_storage_ptr__;
          local_1314 = local_13d0;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_18a8);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe480);
        local_18e8 = local_1910;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe480);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe480);
        while (bVar2 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_1928,&local_1940), bVar2) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_195c,&local_1928);
          local_ea8 = &local_1820;
          local_eb0 = &local_1700;
          local_eb8 = &local_1538;
          for (local_f14 = local_195c.smallend.vect[2]; iVar1 = local_195c.smallend.vect[1],
              (int)local_f14 <= local_195c.bigend.vect[2]; local_f14 = local_f14 + 1) {
            while (local_f18 = iVar1, iVar1 = local_195c.smallend.vect[0],
                  local_f18 <= local_195c.bigend.vect[1]) {
              while (local_f1c = iVar1, local_f1c <= local_195c.bigend.vect[0]) {
                local_aac = local_f1c + 1;
                local_ab0 = local_f18;
                local_ab4 = local_f14;
                local_ab8 = 0;
                local_ac4 = local_f1c + 1;
                local_ac8 = local_f18 + -1;
                local_acc = local_f14;
                local_ad0 = 0;
                local_adc = local_f1c + -1;
                local_ae0 = local_f18;
                local_ae4 = local_f14;
                local_ae8 = 0;
                local_af4 = local_f1c + -1;
                local_af8 = local_f18 + -1;
                local_afc = local_f14;
                local_b00 = 0;
                local_f28 = (((*(double *)
                                (local_1700 +
                                ((long)(local_aac - local_16e0) +
                                 (local_f18 - local_16dc) * local_16f8 +
                                (int)(local_f14 - local_16d8) * local_16f0) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_ac4 - local_16e0) +
                                (local_ac8 - local_16dc) * local_16f8 +
                               (int)(local_f14 - local_16d8) * local_16f0) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_adc - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                              (int)(local_f14 - local_16d8) * local_16f0) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_af4 - local_16e0) + (local_af8 - local_16dc) * local_16f8
                             + (int)(local_f14 - local_16d8) * local_16f0) * 8)) *
                            local_1538.arr[0] * 0.25;
                local_b0c = local_f1c + 1;
                local_b10 = local_f18;
                local_b14 = local_f14;
                local_b18 = 1;
                local_b24 = local_f1c + 1;
                local_b28 = local_f18 + -1;
                local_b2c = local_f14;
                local_b30 = 1;
                local_b3c = local_f1c + -1;
                local_b40 = local_f18;
                local_b44 = local_f14;
                local_b48 = 1;
                local_b54 = local_f1c + -1;
                local_b58 = local_f18 + -1;
                local_b5c = local_f14;
                local_b60 = 1;
                local_f30 = (((*(double *)
                                (local_1700 +
                                ((long)(local_b0c - local_16e0) +
                                 (local_f18 - local_16dc) * local_16f8 +
                                 (int)(local_f14 - local_16d8) * local_16f0 + local_16e8) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_b24 - local_16e0) +
                                (local_b28 - local_16dc) * local_16f8 +
                                (int)(local_f14 - local_16d8) * local_16f0 + local_16e8) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_b3c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                               (int)(local_f14 - local_16d8) * local_16f0 + local_16e8) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_b54 - local_16e0) + (local_b58 - local_16dc) * local_16f8
                              + (int)(local_f14 - local_16d8) * local_16f0 + local_16e8) * 8)) *
                            local_1538.arr[0] * 0.25;
                local_b6c = local_f1c + 1;
                local_b70 = local_f18;
                local_b74 = local_f14;
                local_b78 = 2;
                local_b84 = local_f1c + 1;
                local_b88 = local_f18 + -1;
                local_b8c = local_f14;
                local_b90 = 2;
                local_b9c = local_f1c + -1;
                local_ba0 = local_f18;
                local_ba4 = local_f14;
                local_ba8 = 2;
                local_bb4 = local_f1c + -1;
                local_bb8 = local_f18 + -1;
                local_bbc = local_f14;
                local_bc0 = 2;
                local_f38 = (((*(double *)
                                (local_1700 +
                                ((long)(local_b6c - local_16e0) +
                                 (local_f18 - local_16dc) * local_16f8 +
                                 (int)(local_f14 - local_16d8) * local_16f0 + local_16e8 * 2) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_b84 - local_16e0) +
                                (local_b88 - local_16dc) * local_16f8 +
                                (int)(local_f14 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_b9c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                               (int)(local_f14 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_bb4 - local_16e0) + (local_bb8 - local_16dc) * local_16f8
                              + (int)(local_f14 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                            local_1538.arr[0] * 0.25;
                local_bcc = local_f1c;
                local_bd0 = local_f18;
                local_bd4 = local_f14;
                local_bd8 = 0;
                local_be4 = local_f1c;
                local_be8 = local_f18 + -1;
                local_bec = local_f14;
                local_bf0 = 0;
                local_f40 = (*(double *)
                              (local_1700 +
                              ((long)(local_f1c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                              (int)(local_f14 - local_16d8) * local_16f0) * 8) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_f1c - local_16e0) + (local_be8 - local_16dc) * local_16f8
                             + (int)(local_f14 - local_16d8) * local_16f0) * 8)) * local_1538.arr[1]
                ;
                local_bfc = local_f1c;
                local_c00 = local_f18;
                local_c04 = local_f14;
                local_c08 = 1;
                local_c14 = local_f1c;
                local_c18 = local_f18 + -1;
                local_c1c = local_f14;
                local_c20 = 1;
                local_f48 = (*(double *)
                              (local_1700 +
                              ((long)(local_f1c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                               (int)(local_f14 - local_16d8) * local_16f0 + local_16e8) * 8) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_f1c - local_16e0) + (local_c18 - local_16dc) * local_16f8
                              + (int)(local_f14 - local_16d8) * local_16f0 + local_16e8) * 8)) *
                            local_1538.arr[1];
                local_c2c = local_f1c;
                local_c30 = local_f18;
                local_c34 = local_f14;
                local_c38 = 2;
                local_c44 = local_f1c;
                local_c48 = local_f18 + -1;
                local_c4c = local_f14;
                local_c50 = 2;
                local_f50 = (*(double *)
                              (local_1700 +
                              ((long)(local_f1c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                               (int)(local_f14 - local_16d8) * local_16f0 + local_16e8 * 2) * 8) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_f1c - local_16e0) + (local_c48 - local_16dc) * local_16f8
                              + (int)(local_f14 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                            local_1538.arr[1];
                local_c5c = local_f1c;
                local_c60 = local_f18;
                local_c64 = local_f14 + 1;
                local_c68 = 0;
                local_c74 = local_f1c;
                local_c78 = local_f18 + -1;
                local_c7c = local_f14 + 1;
                local_c80 = 0;
                local_c8c = local_f1c;
                local_c90 = local_f18;
                local_c94 = local_f14 - 1;
                local_c98 = 0;
                local_ca4 = local_f1c;
                local_ca8 = local_f18 + -1;
                local_cac = local_f14 - 1;
                local_cb0 = 0;
                local_f58 = (((*(double *)
                                (local_1700 +
                                ((long)(local_f1c - local_16e0) +
                                 (local_f18 - local_16dc) * local_16f8 +
                                (local_c64 - local_16d8) * local_16f0) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_f1c - local_16e0) +
                                (local_c78 - local_16dc) * local_16f8 +
                               (local_c7c - local_16d8) * local_16f0) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_f1c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                              (local_c94 - local_16d8) * local_16f0) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_f1c - local_16e0) + (local_ca8 - local_16dc) * local_16f8
                             + (local_cac - local_16d8) * local_16f0) * 8)) *
                            local_1538.arr[2] * 0.25;
                local_cbc = local_f1c;
                local_cc0 = local_f18;
                local_cc4 = local_f14 + 1;
                local_cc8 = 1;
                local_cd4 = local_f1c;
                local_cd8 = local_f18 + -1;
                local_cdc = local_f14 + 1;
                local_ce0 = 1;
                local_cec = local_f1c;
                local_cf0 = local_f18;
                local_cf4 = local_f14 - 1;
                local_cf8 = 1;
                local_d04 = local_f1c;
                local_d08 = local_f18 + -1;
                local_d0c = local_f14 - 1;
                local_d10 = 1;
                local_f60 = (((*(double *)
                                (local_1700 +
                                ((long)(local_f1c - local_16e0) +
                                 (local_f18 - local_16dc) * local_16f8 +
                                 (local_cc4 - local_16d8) * local_16f0 + local_16e8) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_f1c - local_16e0) +
                                (local_cd8 - local_16dc) * local_16f8 +
                                (local_cdc - local_16d8) * local_16f0 + local_16e8) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_f1c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                               (local_cf4 - local_16d8) * local_16f0 + local_16e8) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_f1c - local_16e0) + (local_d08 - local_16dc) * local_16f8
                              + (local_d0c - local_16d8) * local_16f0 + local_16e8) * 8)) *
                            local_1538.arr[2] * 0.25;
                local_d1c = local_f1c;
                local_d20 = local_f18;
                local_d24 = local_f14 + 1;
                local_d28 = 2;
                local_d34 = local_f1c;
                local_d38 = local_f18 + -1;
                local_d3c = local_f14 + 1;
                local_d40 = 2;
                local_d4c = local_f1c;
                local_d50 = local_f18;
                local_d54 = local_f14 - 1;
                local_d58 = 2;
                local_d64 = local_f1c;
                local_d68 = local_f18 + -1;
                local_d6c = local_f14 - 1;
                local_d70 = 2;
                local_f68 = (((*(double *)
                                (local_1700 +
                                ((long)(local_f1c - local_16e0) +
                                 (local_f18 - local_16dc) * local_16f8 +
                                 (local_d24 - local_16d8) * local_16f0 + local_16e8 * 2) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_f1c - local_16e0) +
                                (local_d38 - local_16dc) * local_16f8 +
                                (local_d3c - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_f1c - local_16e0) +
                               (local_f18 - local_16dc) * local_16f8 +
                               (local_d54 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_f1c - local_16e0) + (local_d68 - local_16dc) * local_16f8
                              + (local_d6c - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                            local_1538.arr[2] * 0.25;
                local_d7c = local_f1c;
                local_d80 = local_f18;
                local_d84 = local_f14;
                local_d88 = 0;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride] = local_f28;
                local_d94 = local_f1c;
                local_d98 = local_f18;
                local_d9c = local_f14;
                local_da0 = 1;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride] =
                     local_f30;
                local_dac = local_f1c;
                local_db0 = local_f18;
                local_db4 = local_f14;
                local_db8 = 2;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride * 2
                ] = local_f38;
                local_dc4 = local_f1c;
                local_dc8 = local_f18;
                local_dcc = local_f14;
                local_dd0 = 3;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride * 3
                ] = local_f40;
                local_ddc = local_f1c;
                local_de0 = local_f18;
                local_de4 = local_f14;
                local_de8 = 4;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride * 4
                ] = local_f48;
                local_df4 = local_f1c;
                local_df8 = local_f18;
                local_dfc = local_f14;
                local_e00 = 5;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride * 5
                ] = local_f50;
                local_e0c = local_f1c;
                local_e10 = local_f18;
                local_e14 = local_f14;
                local_e18 = 6;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride * 6
                ] = local_f58;
                local_e24 = local_f1c;
                local_e28 = local_f18;
                local_e2c = local_f14;
                local_e30 = 7;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride * 7
                ] = local_f60;
                local_e3c = local_f1c;
                local_e40 = local_f18;
                local_e44 = local_f14;
                local_e48 = 8;
                local_1820.p
                [(long)(local_f1c - local_1820.begin.x) +
                 (local_f18 - local_1820.begin.y) * local_1820.jstride +
                 (int)(local_f14 - local_1820.begin.z) * local_1820.kstride + local_1820.nstride * 8
                ] = local_f68;
                local_e38 = local_ea8;
                local_e20 = local_ea8;
                local_e08 = local_ea8;
                local_df0 = local_ea8;
                local_dd8 = local_ea8;
                local_dc0 = local_ea8;
                local_da8 = local_ea8;
                local_d90 = local_ea8;
                local_d78 = local_ea8;
                local_d60 = local_eb0;
                local_d48 = local_eb0;
                local_d30 = local_eb0;
                local_d18 = local_eb0;
                local_d00 = local_eb0;
                local_ce8 = local_eb0;
                local_cd0 = local_eb0;
                local_cb8 = local_eb0;
                local_ca0 = local_eb0;
                local_c88 = local_eb0;
                local_c70 = local_eb0;
                local_c58 = local_eb0;
                local_c40 = local_eb0;
                local_c28 = local_eb0;
                local_c10 = local_eb0;
                local_bf8 = local_eb0;
                local_be0 = local_eb0;
                local_bc8 = local_eb0;
                local_bb0 = local_eb0;
                local_b98 = local_eb0;
                local_b80 = local_eb0;
                local_b68 = local_eb0;
                local_b50 = local_eb0;
                local_b38 = local_eb0;
                local_b20 = local_eb0;
                local_b08 = local_eb0;
                local_af0 = local_eb0;
                local_ad8 = local_eb0;
                local_ac0 = local_eb0;
                local_aa8 = local_eb0;
                iVar1 = local_f1c + 1;
              }
              iVar1 = local_f18 + 1;
            }
          }
          local_ea0 = &local_195c;
          local_e88 = &local_195c;
          local_e60 = &local_195c;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1928);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe480);
        local_1968 = local_1990;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe480);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe480);
        while (bVar2 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_19a8,&local_19c0), bVar2) {
          in_stack_ffffffffffffe490 = (Box *)(local_1a04 + 0x28);
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    (in_stack_ffffffffffffe490,&local_19a8);
          local_9e0 = &local_1860;
          local_9e8 = &local_1700;
          local_9f0 = &local_1538;
          local_9b4 = (in_stack_ffffffffffffe490->smallend).vect[0];
          iStack_9b0 = (in_stack_ffffffffffffe490->smallend).vect[1];
          local_a28 = *(undefined8 *)(in_stack_ffffffffffffe490->smallend).vect;
          local_98c = (in_stack_ffffffffffffe490->bigend).vect[0];
          iStack_988 = (in_stack_ffffffffffffe490->bigend).vect[1];
          local_a48 = *(undefined8 *)(in_stack_ffffffffffffe490->bigend).vect;
          local_a40 = (in_stack_ffffffffffffe490->bigend).vect[2];
          local_a20 = (in_stack_ffffffffffffe490->smallend).vect[2];
          for (local_a4c = local_a20; iVar1 = iStack_9b0, local_a4c <= local_a40;
              local_a4c = local_a4c + 1) {
            while (local_a50 = iVar1, iVar1 = local_9b4, local_a50 <= iStack_988) {
              while (local_a54 = iVar1, local_a54 <= local_98c) {
                local_a60 = (((*(double *)
                                (local_1700 +
                                ((long)((local_a54 + 1) - local_16e0) +
                                 (local_a50 - local_16dc) * local_16f8 +
                                (local_a4c - local_16d8) * local_16f0) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)((local_a54 + 1) - local_16e0) +
                                (local_a50 - local_16dc) * local_16f8 +
                               ((local_a4c + -1) - local_16d8) * local_16f0) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)((local_a54 + -1) - local_16e0) +
                               (local_a50 - local_16dc) * local_16f8 +
                              (local_a4c - local_16d8) * local_16f0) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)((local_a54 + -1) - local_16e0) +
                              (local_a50 - local_16dc) * local_16f8 +
                             ((local_a4c + -1) - local_16d8) * local_16f0) * 8)) *
                            local_1538.arr[0] * 0.25;
                local_a68 = (((*(double *)
                                (local_1700 +
                                ((long)((local_a54 + 1) - local_16e0) +
                                 (local_a50 - local_16dc) * local_16f8 +
                                 (local_a4c - local_16d8) * local_16f0 + local_16e8) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)((local_a54 + 1) - local_16e0) +
                                (local_a50 - local_16dc) * local_16f8 +
                                ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)((local_a54 + -1) - local_16e0) +
                               (local_a50 - local_16dc) * local_16f8 +
                               (local_a4c - local_16d8) * local_16f0 + local_16e8) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)((local_a54 + -1) - local_16e0) +
                              (local_a50 - local_16dc) * local_16f8 +
                              ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8) * 8)) *
                            local_1538.arr[0] * 0.25;
                local_a70 = (((*(double *)
                                (local_1700 +
                                ((long)((local_a54 + 1) - local_16e0) +
                                 (local_a50 - local_16dc) * local_16f8 +
                                 (local_a4c - local_16d8) * local_16f0 + local_16e8 * 2) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)((local_a54 + 1) - local_16e0) +
                                (local_a50 - local_16dc) * local_16f8 +
                                ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8 * 2) * 8))
                             - *(double *)
                                (local_1700 +
                                ((long)((local_a54 + -1) - local_16e0) +
                                 (local_a50 - local_16dc) * local_16f8 +
                                 (local_a4c - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)((local_a54 + -1) - local_16e0) +
                              (local_a50 - local_16dc) * local_16f8 +
                              ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                            local_1538.arr[0] * 0.25;
                local_a78 = (((*(double *)
                                (local_1700 +
                                ((long)(local_a54 - local_16e0) +
                                 ((local_a50 + 1) - local_16dc) * local_16f8 +
                                (local_a4c - local_16d8) * local_16f0) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_a54 - local_16e0) +
                                ((local_a50 + 1) - local_16dc) * local_16f8 +
                               ((local_a4c + -1) - local_16d8) * local_16f0) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_a54 - local_16e0) +
                               ((local_a50 + -1) - local_16dc) * local_16f8 +
                              (local_a4c - local_16d8) * local_16f0) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_a54 - local_16e0) +
                              ((local_a50 + -1) - local_16dc) * local_16f8 +
                             ((local_a4c + -1) - local_16d8) * local_16f0) * 8)) *
                            local_1538.arr[1] * 0.25;
                local_a80 = (((*(double *)
                                (local_1700 +
                                ((long)(local_a54 - local_16e0) +
                                 ((local_a50 + 1) - local_16dc) * local_16f8 +
                                 (local_a4c - local_16d8) * local_16f0 + local_16e8) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_a54 - local_16e0) +
                                ((local_a50 + 1) - local_16dc) * local_16f8 +
                                ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8) * 8)) -
                             *(double *)
                              (local_1700 +
                              ((long)(local_a54 - local_16e0) +
                               ((local_a50 + -1) - local_16dc) * local_16f8 +
                               (local_a4c - local_16d8) * local_16f0 + local_16e8) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_a54 - local_16e0) +
                              ((local_a50 + -1) - local_16dc) * local_16f8 +
                              ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8) * 8)) *
                            local_1538.arr[1] * 0.25;
                local_a88 = (((*(double *)
                                (local_1700 +
                                ((long)(local_a54 - local_16e0) +
                                 ((local_a50 + 1) - local_16dc) * local_16f8 +
                                 (local_a4c - local_16d8) * local_16f0 + local_16e8 * 2) * 8) +
                              *(double *)
                               (local_1700 +
                               ((long)(local_a54 - local_16e0) +
                                ((local_a50 + 1) - local_16dc) * local_16f8 +
                                ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8 * 2) * 8))
                             - *(double *)
                                (local_1700 +
                                ((long)(local_a54 - local_16e0) +
                                 ((local_a50 + -1) - local_16dc) * local_16f8 +
                                 (local_a4c - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_a54 - local_16e0) +
                              ((local_a50 + -1) - local_16dc) * local_16f8 +
                              ((local_a4c + -1) - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                            local_1538.arr[1] * 0.25;
                local_a90 = (*(double *)
                              (local_1700 +
                              ((long)(local_a54 - local_16e0) +
                               (local_a50 - local_16dc) * local_16f8 +
                              (local_a4c - local_16d8) * local_16f0) * 8) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_a54 - local_16e0) + (local_a50 - local_16dc) * local_16f8
                             + ((local_a4c + -1) - local_16d8) * local_16f0) * 8)) *
                            local_1538.arr[2];
                local_854 = local_a54;
                local_858 = local_a50;
                local_85c = local_a4c;
                local_860 = 1;
                local_86c = local_a54;
                local_870 = local_a50;
                local_874 = local_a4c + -1;
                local_878 = 1;
                local_a98 = (*(double *)
                              (local_1700 +
                              ((long)(local_a54 - local_16e0) +
                               (local_a50 - local_16dc) * local_16f8 +
                               (local_a4c - local_16d8) * local_16f0 + local_16e8) * 8) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_a54 - local_16e0) + (local_a50 - local_16dc) * local_16f8
                              + (local_874 - local_16d8) * local_16f0 + local_16e8) * 8)) *
                            local_1538.arr[2];
                local_884 = local_a54;
                local_888 = local_a50;
                local_88c = local_a4c;
                local_890 = 2;
                local_89c = local_a54;
                local_8a0 = local_a50;
                local_8a4 = local_a4c + -1;
                local_8a8 = 2;
                local_aa0 = (*(double *)
                              (local_1700 +
                              ((long)(local_a54 - local_16e0) +
                               (local_a50 - local_16dc) * local_16f8 +
                               (local_a4c - local_16d8) * local_16f0 + local_16e8 * 2) * 8) -
                            *(double *)
                             (local_1700 +
                             ((long)(local_a54 - local_16e0) + (local_a50 - local_16dc) * local_16f8
                              + (local_8a4 - local_16d8) * local_16f0 + local_16e8 * 2) * 8)) *
                            local_1538.arr[2];
                local_8b4 = local_a54;
                local_8b8 = local_a50;
                local_8bc = local_a4c;
                local_8c0 = 0;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride] = local_a60;
                local_8cc = local_a54;
                local_8d0 = local_a50;
                local_8d4 = local_a4c;
                local_8d8 = 1;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride] =
                     local_a68;
                local_8e4 = local_a54;
                local_8e8 = local_a50;
                local_8ec = local_a4c;
                local_8f0 = 2;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride * 2] =
                     local_a70;
                local_8fc = local_a54;
                local_900 = local_a50;
                local_904 = local_a4c;
                local_908 = 3;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride * 3] =
                     local_a78;
                local_914 = local_a54;
                local_918 = local_a50;
                local_91c = local_a4c;
                local_920 = 4;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride * 4] =
                     local_a80;
                local_92c = local_a54;
                local_930 = local_a50;
                local_934 = local_a4c;
                local_938 = 5;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride * 5] =
                     local_a88;
                local_944 = local_a54;
                local_948 = local_a50;
                local_94c = local_a4c;
                local_950 = 6;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride * 6] =
                     local_a90;
                local_95c = local_a54;
                local_960 = local_a50;
                local_964 = local_a4c;
                local_968 = 7;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride * 7] =
                     local_a98;
                local_974 = local_a54;
                local_978 = local_a50;
                local_97c = local_a4c;
                local_980 = 8;
                local_1860.p
                [(long)(local_a54 - local_1860.begin.x) +
                 (local_a50 - local_1860.begin.y) * local_1860.jstride +
                 (local_a4c - local_1860.begin.z) * local_1860.kstride + local_1860.nstride * 8] =
                     local_aa0;
                local_970 = local_9e0;
                local_958 = local_9e0;
                local_940 = local_9e0;
                local_928 = local_9e0;
                local_910 = local_9e0;
                local_8f8 = local_9e0;
                local_8e0 = local_9e0;
                local_8c8 = local_9e0;
                local_8b0 = local_9e0;
                local_898 = local_9e8;
                local_880 = local_9e8;
                local_868 = local_9e8;
                iVar1 = local_a54 + 1;
              }
              iVar1 = local_a50 + 1;
            }
          }
          local_a34 = local_a48;
          local_a2c = local_a40;
          local_a18 = local_a28;
          local_a10 = local_a20;
          local_9d8 = in_stack_ffffffffffffe490;
          local_9d0 = local_a28;
          local_9c8 = local_a20;
          local_9c0 = in_stack_ffffffffffffe490;
          local_9ac = local_a20;
          local_9a8 = local_a48;
          local_9a0 = local_a40;
          local_998 = in_stack_ffffffffffffe490;
          local_984 = local_a40;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_19a8);
        }
        for (local_1a04._36_4_ = 0; (int)local_1a04._36_4_ < 3;
            local_1a04._36_4_ = local_1a04._36_4_ + 1) {
          in_stack_ffffffffffffe480 = (FabArray<amrex::EBCellFlagFab> *)local_1a04;
          in_stack_ffffffffffffe488 = (FabArray<amrex::FArrayBox> *)local_1688;
          MFIter::nodaltilebox(this_02,dir);
          local_1a04._28_8_ = in_stack_ffffffffffffe480;
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe480,(size_type)mfi_00);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe488,(MFIter *)in_stack_ffffffffffffe480);
          pvVar4 = std::array<amrex::FArrayBox,_3UL>::operator[]
                             ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe480,
                              (size_type)mfi_00);
          local_378 = (pvVar4->super_BaseFab<double>).dptr;
          local_380 = &(pvVar4->super_BaseFab<double>).domain;
          local_384 = (pvVar4->super_BaseFab<double>).nvar;
          local_32c = 0;
          local_358 = (local_380->smallend).vect[0];
          local_33c = 1;
          iStack_354 = (pvVar4->super_BaseFab<double>).domain.smallend.vect[1];
          local_3a0.x = (local_380->smallend).vect[0];
          local_3a0.y = (local_380->smallend).vect[1];
          local_34c = 2;
          local_3a0.z = (pvVar4->super_BaseFab<double>).domain.smallend.vect[2];
          local_2d8 = &(pvVar4->super_BaseFab<double>).domain.bigend;
          local_2dc = 0;
          local_308 = local_2d8->vect[0] + 1;
          local_2e8 = &(pvVar4->super_BaseFab<double>).domain.bigend;
          local_2ec = 1;
          iStack_304 = (pvVar4->super_BaseFab<double>).domain.bigend.vect[1] + 1;
          local_2f8 = &(pvVar4->super_BaseFab<double>).domain.bigend;
          local_2fc = 2;
          local_3b0.z = (pvVar4->super_BaseFab<double>).domain.bigend.vect[2] + 1;
          local_3b0.y = iStack_304;
          local_3b0.x = local_308;
          local_390._0_8_ = local_3a0._0_8_;
          local_390.z = local_3a0.z;
          local_370._0_8_ = local_3a0._0_8_;
          local_370.z = local_3a0.z;
          local_360 = local_380;
          local_350 = local_3a0.z;
          local_348 = local_380;
          local_338 = local_380;
          local_328 = local_380;
          local_320._0_8_ = local_3b0._0_8_;
          local_320.z = local_3b0.z;
          local_310 = local_380;
          local_300 = local_3b0.z;
          Array4<const_double>::Array4
                    ((Array4<const_double> *)&local_1a88,local_378,&local_390,&local_3b0,local_384);
          local_14d0 = (FabArray<amrex::EBCellFlagFab> *)local_1a04._28_8_;
          local_14c4 = *(int *)local_1a04._28_8_;
          CStack_14c0 = *(CoordType *)(local_1a04._28_8_ + 4);
          local_14e0 = *(undefined8 *)local_1a04._28_8_;
          local_14d8 = (((BoxArray *)(local_1a04._28_8_ + 8))->m_bat).m_bat_type;
          local_14a8 = (FabArray<amrex::EBCellFlagFab> *)local_1a04._28_8_;
          local_149c = (((BATOp *)(local_1a04._28_8_ + 0xc))->m_indexType).m_typ.itype;
          CStack_1498 = (((Geometry *)(local_1a04._28_8_ + 0x10))->super_CoordSys).c_sys;
          local_14b8 = *(undefined8 *)(local_1a04._28_8_ + 0xc);
          local_14b0 = *(int *)(local_1a04._28_8_ + 0x14);
          for (local_1acc = 0; local_1ad0 = local_14d8, local_1acc < 9; local_1acc = local_1acc + 1)
          {
            for (; local_1ad4 = CStack_14c0, (int)local_1ad0 <= local_14b0;
                local_1ad0 = local_1ad0 + basic) {
              for (; local_1ad8 = local_14c4, local_1ad4 <= CStack_1498;
                  local_1ad4 = local_1ad4 + RZ) {
                for (; local_1ad8 <= (int)local_149c; local_1ad8 = local_1ad8 + 1) {
                  local_1454 = local_1ad8;
                  local_1458 = local_1ad4;
                  local_145c = local_1ad0;
                  local_1460 = local_1acc;
                  local_1450 = &local_1a88;
                  local_1484 = local_1ad8;
                  local_1488 = local_1ad4;
                  local_148c = local_1ad0;
                  local_1490 = local_1acc;
                  local_1480 = &local_1a48;
                  *(double *)
                   (local_1a48 +
                   ((long)(local_1ad8 - local_1a28) + (local_1ad4 - local_1a24) * local_1a40 +
                    (int)(local_1ad0 - local_1a20) * local_1a38 + local_1acc * local_1a30) * 8) =
                       local_1a88
                       [(long)(local_1ad8 - local_1a68) + (local_1ad4 - local_1a64) * local_1a80 +
                        (int)(local_1ad0 - (int)in_stack_ffffffffffffe5a0) * local_1a78 +
                        local_1acc * local_1a70];
                }
              }
            }
          }
          local_14bc = local_14d8;
          local_1494 = local_14b0;
        }
        Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffe480);
        Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffe480);
        Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffe480);
      }
      else if (local_1504 == 0) {
        local_1470 = "compVelGrad not yet implemented for cut-cells  ";
        Abort_host((char *)in_stack_ffffffffffffe490);
      }
      else {
        local_1478 = "compVelGrad not yet implemented for cut-cells  ";
        Abort_host((char *)in_stack_ffffffffffffe490);
      }
    }
    MFIter::operator++((MFIter *)local_1688);
  }
  MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe480);
  std::array<amrex::FArrayBox,_3UL>::~array
            ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe490);
  return;
}

Assistant:

void
MLEBTensorOp::compVelGrad (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& fluxes,
                       MultiFab& sol, Location loc) const
{
    BL_PROFILE("MLEBTensorOp::compVelGrad()");

    if ( !(loc==Location::FaceCenter || loc==Location::FaceCentroid) )
      amrex::Abort("MLEBTensorOp::compVelGrad() unknown location for VelGradients.");

    const int mglev = 0;

    applyBCTensor(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution, m_bndry_sol[amrlev].get());

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    const int dim_fluxes = AMREX_SPACEDIM*AMREX_SPACEDIM;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  {
    Array<FArrayBox,AMREX_SPACEDIM> fluxfab_tmp;
    for (MFIter mfi(sol, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        if (fabtyp == FabType::regular)
        {

            Array4<Real const> const vfab = sol.const_array(mfi);
            AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                         Box const ybx = mfi.nodaltilebox(1);,
                         Box const zbx = mfi.nodaltilebox(2););
            AMREX_D_TERM(fluxfab_tmp[0].resize(xbx,dim_fluxes);,
                         fluxfab_tmp[1].resize(ybx,dim_fluxes);,
                         fluxfab_tmp[2].resize(zbx,dim_fluxes););
            AMREX_D_TERM(Elixir fxeli = fluxfab_tmp[0].elixir();,
                         Elixir fyeli = fluxfab_tmp[1].elixir();,
                         Elixir fzeli = fluxfab_tmp[2].elixir(););
            AMREX_D_TERM(Array4<Real> const fxfab = fluxfab_tmp[0].array();,
                         Array4<Real> const fyfab = fluxfab_tmp[1].array();,
                         Array4<Real> const fzfab = fluxfab_tmp[2].array(););
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                  mltensor_vel_grads_fx(txbx,fxfab,vfab,dxinv);
              }
            , ybx, tybx,
              {
                  mltensor_vel_grads_fy(tybx,fyfab,vfab,dxinv);
              }
            , zbx, tzbx,
              {
                  mltensor_vel_grads_fz(tzbx,fzfab,vfab,dxinv);
              }
            );

// The derivatives are put in the array with the following order:
// component: 0    ,  1    ,  2    ,  3    ,  4    , 5    ,  6    ,  7    ,  8
// in 2D:     dU/dx,  dV/dx,  dU/dy,  dV/dy
// in 3D:     dU/dx,  dV/dx,  dW/dx,  dU/dy,  dV/dy, dW/dy,  dU/dz,  dV/dz,  dW/dz


            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                const Box& nbx = mfi.nodaltilebox(idim);
                Array4<Real      > dst = fluxes[idim]->array(mfi);
                Array4<Real const> src = fluxfab_tmp[idim].const_array();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D (nbx, dim_fluxes, i, j, k, n,
                {
                    dst(i,j,k,n) = src(i,j,k,n);
                });
            }


        }
        else if ( loc==Location::FaceCenter )
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }
        else // loc==Location::FaceCentroid
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }

    }
  }
}